

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

TPZSkylMatrix<double> * __thiscall
TPZSkylMatrix<double>::operator-=(TPZSkylMatrix<double> *this,TPZSkylMatrix<double> *A)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TPZSkylMatrix<double> TStack_78;
  
  iVar1 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])();
  iVar2 = (*(A->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xc])
                    (A);
  if (CONCAT44(extraout_var,iVar1) != CONCAT44(extraout_var_00,iVar2)) {
    TPZMatrix<double>::Error
              ("TPZSkylMatrix<TVar> &TPZSkylMatrix<double>::operator-=(const TPZSkylMatrix<TVar> &) [TVar = double]"
               ,"operator+=( TPZSkylMatrix ) <incompatible dimensions>");
  }
  operator-(&TStack_78,this,A);
  operator=(this,&TStack_78);
  ~TPZSkylMatrix(&TStack_78);
  return this;
}

Assistant:

TPZSkylMatrix<TVar> &
TPZSkylMatrix<TVar>::operator-=(const TPZSkylMatrix<TVar> &A )
{
  if ( this->Dim() != A.Dim() )
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"operator+=( TPZSkylMatrix ) <incompatible dimensions>" );

	*this = *this - A;
	return *this;
}